

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O2

BigInteger * __thiscall
Rational::operator_cast_to_BigInteger(BigInteger *__return_storage_ptr__,Rational *this)

{
  bool bVar1;
  BigInteger BStack_48;
  
  BigInteger::BigInteger(&BStack_48,1);
  bVar1 = operator==(&this->_denominator,&BStack_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_48);
  if (bVar1) {
    BigInteger::BigInteger(__return_storage_ptr__,&this->_numerator);
  }
  else {
    operator/(__return_storage_ptr__,&this->_numerator,&this->_denominator);
  }
  return __return_storage_ptr__;
}

Assistant:

explicit operator const BigInteger() const
    {
        if(_denominator == 1)
            return _numerator;
        return _numerator / _denominator;
    }